

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O3

bool EqualityHelper(Sexp *first,Sexp *second)

{
  Kind KVar1;
  bool bVar2;
  int iVar3;
  ContractFrame *in_RAX;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  
  local_28.protected_frame = in_RAX;
  ContractFrameProtector::ContractFrameProtector(&local_28,"EqualityHelper");
  ContractFrame::AddContract(local_28.protected_frame,NoGc);
  KVar1 = second->kind;
  if (first->kind == CONS) {
    if ((KVar1 == CONS) &&
       (bVar2 = EqualityHelper((first->field_1).cons.car,(second->field_1).cons.car), bVar2)) {
      if ((first->kind != CONS) || (second->kind != CONS)) {
        __assert_fail("IsCons()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.h"
                      ,0xcd,"Sexp *Sexp::Cdr() const");
      }
      bVar2 = EqualityHelper((first->field_1).cons.cdr,(second->field_1).cons.cdr);
      goto LAB_00119a15;
    }
  }
  else if (KVar1 != CONS) {
    switch(first->kind) {
    case SYMBOL:
      if (KVar1 == SYMBOL) {
        bVar2 = (first->field_1).cons.car == (second->field_1).cons.car;
        goto LAB_00119a15;
      }
      break;
    case STRING:
      if (KVar1 == STRING) {
        iVar3 = strcmp((first->field_1).string_value,(second->field_1).string_value);
        bVar2 = iVar3 == 0;
        goto LAB_00119a15;
      }
      break;
    case FIXNUM:
      if (KVar1 == FIXNUM) {
        bVar2 = (bool)(-((second->field_1).fixnum_value == (first->field_1).fixnum_value) & 1);
        goto LAB_00119a15;
      }
      break;
    case BOOL:
      if (KVar1 == BOOL) {
        bVar2 = (first->field_1).bool_value == (second->field_1).bool_value;
        goto LAB_00119a15;
      }
    }
    if (first == second) {
      bVar2 = true;
      goto LAB_00119a15;
    }
  }
  bVar2 = false;
LAB_00119a15:
  ContractFrameProtector::~ContractFrameProtector(&local_28);
  return bVar2;
}

Assistant:

bool EqualityHelper(Sexp *first, Sexp *second) {
  CONTRACT { FORBID_GC; }